

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O0

double maths::Matrix::dotProduct(Matrix *a,Matrix *b)

{
  double dVar1;
  double *pdVar2;
  Matrix *in_RSI;
  Matrix *in_RDI;
  int i;
  double sum;
  int local_1c;
  double local_18;
  
  local_18 = 0.0;
  for (local_1c = 0; local_1c < in_RDI->rows_; local_1c = local_1c + 1) {
    pdVar2 = operator()(in_RDI,local_1c,0);
    dVar1 = *pdVar2;
    pdVar2 = operator()(in_RSI,local_1c,0);
    local_18 = dVar1 * *pdVar2 + local_18;
  }
  return local_18;
}

Assistant:

double Matrix::dotProduct(Matrix a, Matrix b)
{
    double sum = 0;
    for (int i = 0; i < a.rows_; ++i) {
        sum += (a(i, 0) * b(i, 0));
    }
    return sum;
}